

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode done_sending(connectdata *conn,SingleRequest *k)

{
  CURLcode result;
  SingleRequest *k_local;
  connectdata *conn_local;
  
  k->keepon = k->keepon & 0xfffffffd;
  if (((*(uint *)&(conn->bits).field_0x4 >> 0x10 & 1) == 0) ||
     (conn_local._4_4_ = Curl_readrewind(conn), conn_local._4_4_ == CURLE_OK)) {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode done_sending(struct connectdata *conn,
                             struct SingleRequest *k)
{
  k->keepon &= ~KEEP_SEND; /* we're done writing */

  Curl_http2_done_sending(conn);

  if(conn->bits.rewindaftersend) {
    CURLcode result = Curl_readrewind(conn);
    if(result)
      return result;
  }
  return CURLE_OK;
}